

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

unsigned_short * __thiscall
Memory::AllocateArray<Memory::Recycler,unsigned_short,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  unsigned_short *puVar1;
  size_t byteSize;
  
  if (count != 0) {
    byteSize = 0xffffffffffffffff;
    if (-1 < (long)count) {
      byteSize = count * 2;
    }
    puVar1 = (unsigned_short *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    return puVar1;
  }
  Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
  return (unsigned_short *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}